

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddTargetItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  int iVar4;
  string *psVar5;
  char *__s;
  cmAlphaNum *this_02;
  string_view suffix;
  string_view str;
  allocator<char> local_119;
  cmGeneratorTarget *target;
  undefined1 local_110 [32];
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  
  this_00 = entry->Target;
  target = this_00;
  TVar3 = cmGeneratorTarget::GetType(this_00);
  if (TVar3 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar3 = cmGeneratorTarget::GetType(this_00);
  if (TVar3 == SHARED_LIBRARY) {
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&this->SharedLibrariesLinked,&target);
  }
  if ((this->NoSONameUsesPath == true) &&
     (bVar1 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(target,&this->Config), bVar1)) {
    AddSharedLibNoSOName(this,entry);
    return;
  }
  if ((this->OldLinkDirMode == true) &&
     (bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target), !bVar1)) {
    cmsys::SystemTools::GetFilenamePath((string *)&fwDescriptor,(string *)entry);
    bVar1 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&this->OldLinkDirMask,(string *)&fwDescriptor);
    std::__cxx11::string::~string((string *)&fwDescriptor);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,(value_type *)entry);
    }
  }
  bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if ((!bVar1) ||
     (iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(), (char)iVar4 != '\0')) {
    local_c0.View_._M_len = CONCAT44(local_c0.View_._M_len._4_4_,1);
    _Var2 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
    if (_Var2) {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target);
      if (bVar1) {
        iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
        __s = "__CMAKE_LINK_LIBRARY";
        if ((char)iVar4 != '\0') {
          __s = "__CMAKE_LINK_FRAMEWORK";
        }
      }
      else {
        __s = "__CMAKE_LINK_LIBRARY";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fwDescriptor,__s,(allocator<char> *)local_110);
    }
    else {
      std::__cxx11::string::string((string *)&fwDescriptor,(string *)&entry->Feature);
    }
    local_f0.View_._M_len = (size_t)FindLibraryFeature(this,(string *)&fwDescriptor);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&entry->Item,(ItemIsPath *)&local_c0,&target,(FeatureDescriptor **)&local_f0)
    ;
    std::__cxx11::string::~string((string *)&fwDescriptor);
    return;
  }
  cmGlobalGenerator::SplitFrameworkPath
            (&fwDescriptor,this->GlobalGenerator,(string *)entry,Extended);
  if (fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
      _M_payload.super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>
      .super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged == false) {
    this_01 = this->CMakeInstance;
    local_f0.View_._M_len = 0x20;
    local_f0.View_._M_str = "Could not parse framework path \"";
    local_c0.View_._M_str = (entry->Item).Value._M_dataplus._M_p;
    local_c0.View_._M_len = (entry->Item).Value._M_string_length;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_119 = (allocator<char>)0x2e;
    cmStrCat<char[20],std::__cxx11::string,char>
              ((string *)local_110,&local_f0,&local_c0,(char (*) [20])"\" linked by target ",psVar5,
               (char *)&local_119);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)local_110,&(entry->Item).Backtrace);
    this_02 = (cmAlphaNum *)local_110;
  }
  else {
    if (fwDescriptor.super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>.
        _M_payload.
        super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
        super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_payload._M_value.
        Directory._M_string_length != 0) {
      AddFrameworkPath(this,(string *)&fwDescriptor);
    }
    suffix._M_str = "FRAMEWORK";
    suffix._M_len = 9;
    str._M_str = (entry->Feature)._M_dataplus._M_p;
    str._M_len = (entry->Feature)._M_string_length;
    bVar1 = cmHasSuffix(str,suffix);
    psVar5 = &entry->Feature;
    if (!bVar1) {
      local_110._0_4_ = Yes;
      _Var2 = std::operator==(psVar5,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
      if (_Var2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"__CMAKE_LINK_LIBRARY",&local_119);
      }
      else {
        std::__cxx11::string::string((string *)&local_f0,(string *)psVar5);
      }
      local_c0.View_._M_len = (size_t)FindLibraryFeature(this,(string *)&local_f0);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&entry->Item,(ItemIsPath *)local_110,&target,
                 (FeatureDescriptor **)&local_c0);
      std::__cxx11::string::~string((string *)&local_f0);
      goto LAB_002e6aa4;
    }
    cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
              ((string *)&local_f0,(FrameworkDescriptor *)&fwDescriptor);
    local_110._0_4_ = Yes;
    local_c0.View_._M_len = (size_t)FindLibraryFeature(this,psVar5);
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,(ItemIsPath *)local_110,&target,(FeatureDescriptor **)&local_c0);
    this_02 = &local_f0;
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_002e6aa4:
  std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_reset
            ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)&fwDescriptor);
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(LinkEntry const& entry)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  BT<std::string> const& item = entry.Item;
  cmGeneratorTarget const* target = entry.Target;

  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(entry);
    return;
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  if (target->IsFrameworkOnApple() && !this->GlobalGenerator->IsXcode()) {
    // Add the framework directory and the framework item itself
    auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
      item.Value, cmGlobalGenerator::FrameworkFormat::Extended);
    if (!fwDescriptor) {
      this->CMakeInstance->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Could not parse framework path \"", item.Value,
                 "\" linked by target ", this->Target->GetName(), '.'),
        item.Backtrace);
      return;
    }
    if (!fwDescriptor->Directory.empty()) {
      // Add the directory portion to the framework search path.
      this->AddFrameworkPath(fwDescriptor->Directory);
    }
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s)) {
      this->Items.emplace_back(fwDescriptor->GetLinkName(), ItemIsPath::Yes,
                               target,
                               this->FindLibraryFeature(entry.Feature));
    } else {
      this->Items.emplace_back(
        item, ItemIsPath::Yes, target,
        this->FindLibraryFeature(
          entry.Feature == DEFAULT ? "__CMAKE_LINK_LIBRARY" : entry.Feature));
    }
  } else {
    // Now add the full path to the library.
    this->Items.emplace_back(
      item, ItemIsPath::Yes, target,
      this->FindLibraryFeature(
        entry.Feature == DEFAULT
          ? (target->IsFrameworkOnApple() && this->GlobalGenerator->IsXcode()
               ? "__CMAKE_LINK_FRAMEWORK"
               : "__CMAKE_LINK_LIBRARY")
          : entry.Feature));
  }
}